

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_ushl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  
  uVar4 = desc * 8 & 0xff;
  uVar3 = (ulong)(uVar4 + 8);
  uVar5 = 0;
  do {
    bVar6 = *(byte *)((long)vm + uVar5);
    if ((char)bVar6 < '\0') {
      if ((char)bVar6 < -7) goto LAB_005d01ff;
      bVar6 = *(byte *)((long)vn + uVar5) >> (-bVar6 & 0x1f);
    }
    else if ((char)bVar6 < '\b') {
      bVar6 = *(byte *)((long)vn + uVar5) << (bVar6 & 0x1f);
    }
    else {
LAB_005d01ff:
      bVar6 = 0;
    }
    *(byte *)((long)vd + uVar5) = bVar6;
    uVar5 = uVar5 + 1;
    if (uVar3 == uVar5) {
      uVar1 = desc >> 2 & 0xf8;
      if (uVar4 < uVar1) {
        uVar2 = (ulong)(uVar1 + 8);
        uVar5 = uVar3 + 8;
        if (uVar3 + 8 < uVar2) {
          uVar5 = uVar2;
        }
        memset((void *)((long)vd + uVar3),0,(~uVar3 + uVar5 & 0xfffffffffffffff8) + 8);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

void HELPER(gvec_ushl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        uint8_t nn = n[i];
        uint8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            if (mm > -8) {
                res = nn >> -mm;
            }
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}